

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogToFile(int max_depth,char *filename)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  FILE *pFVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *filename_local;
  int max_depth_local;
  
  pIVar2 = GImGui;
  if (((GImGui->LogEnabled & 1U) == 0) &&
     ((pIVar1 = GImGui->CurrentWindow, g = (ImGuiContext *)filename, filename != (char *)0x0 ||
      (g = (ImGuiContext *)(GImGui->IO).LogFilename, g != (ImGuiContext *)0x0)))) {
    if (GImGui->LogFile != (FILE *)0x0) {
      __assert_fail("g.LogFile == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1f64,"void ImGui::LogToFile(int, const char *)");
    }
    pFVar3 = ImFileOpen(&g->Initialized,"ab");
    pIVar2->LogFile = pFVar3;
    if (pIVar2->LogFile == (FILE *)0x0) {
      if (pIVar2->LogFile == (FILE *)0x0) {
        __assert_fail("g.LogFile != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x1f68,"void ImGui::LogToFile(int, const char *)");
      }
    }
    else {
      pIVar2->LogEnabled = true;
      pIVar2->LogStartDepth = (pIVar1->DC).TreeDepth;
      if (-1 < max_depth) {
        pIVar2->LogAutoExpandMaxDepth = max_depth;
      }
    }
  }
  return;
}

Assistant:

void ImGui::LogToFile(int max_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = g.CurrentWindow;

    if (!filename)
    {
        filename = g.IO.LogFilename;
        if (!filename)
            return;
    }

    IM_ASSERT(g.LogFile == NULL);
    g.LogFile = ImFileOpen(filename, "ab");
    if (!g.LogFile)
    {
        IM_ASSERT(g.LogFile != NULL); // Consider this an error
        return;
    }
    g.LogEnabled = true;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}